

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wipe.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_2cafb::circle_in_wiper::play(circle_in_wiper *this)

{
  long lVar1;
  pointer __first;
  pointer __last;
  ulong uVar2;
  __normal_iterator<coord_*,_std::vector<coord,_std::allocator<coord>_>_> __i;
  long lVar3;
  __normal_iterator<coord_*,_std::vector<coord,_std::allocator<coord>_>_> __last_00;
  vector<coord,_std::allocator<coord>_> coords;
  vector<coord,_std::allocator<coord>_> local_38;
  
  wiper::limit_coords(&local_38,&this->super_wiper);
  __last = local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    lVar3 = (long)local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar2 = lVar3 >> 3;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<coord*,std::vector<coord,std::allocator<coord>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::circle_in_wiper::play()::__0>>
              ((__normal_iterator<coord_*,_std::vector<coord,_std::allocator<coord>_>_>)
               local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<coord_*,_std::vector<coord,_std::allocator<coord>_>_>)
               local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
               super__Vector_impl_data._M_finish,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_LegalizeAdulthood[P]vteffect_vteffect_wipe_cpp:130:9)>
                )this);
    if (lVar3 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<coord*,std::vector<coord,std::allocator<coord>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::circle_in_wiper::play()::__0>>
                ((__normal_iterator<coord_*,_std::vector<coord,_std::allocator<coord>_>_>)__first,
                 (__normal_iterator<coord_*,_std::vector<coord,_std::allocator<coord>_>_>)__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_LegalizeAdulthood[P]vteffect_vteffect_wipe_cpp:130:9)>
                  )this);
    }
    else {
      __last_00._M_current = __first + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<coord*,std::vector<coord,std::allocator<coord>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::circle_in_wiper::play()::__0>>
                ((__normal_iterator<coord_*,_std::vector<coord,_std::allocator<coord>_>_>)__first,
                 __last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_LegalizeAdulthood[P]vteffect_vteffect_wipe_cpp:130:9)>
                  )this);
      for (; __last_00._M_current != __last; __last_00._M_current = __last_00._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<coord*,std::vector<coord,std::allocator<coord>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::circle_in_wiper::play()::__0>>
                  (__last_00,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_LegalizeAdulthood[P]vteffect_vteffect_wipe_cpp:130:9)>
                    )this);
      }
    }
  }
  wiper::clear_coords(&this->super_wiper,
                      (It)local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
                          super__Vector_impl_data._M_start,
                      (It)local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
                          super__Vector_impl_data._M_finish);
  if (local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.super__Vector_impl_data.
      _M_start != (coord *)0x0) {
    operator_delete(local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<coord,_std::allocator<coord>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void circle_in_wiper::play()
{
    std::vector<coord> coords = limit_coords();
    std::sort(coords.begin(), coords.end(),
        [this](const coord &lhs, const coord &rhs) {
            int d1 = distance(lhs, m_opts);
            int d2 = distance(rhs, m_opts);
            if (d1 > d2)
            {
                return true;
            }
            if (d1 == d2)
            {
                if (lhs.row > rhs.row)
                {
                    return true;
                }
                if (lhs.row == rhs.row)
                {
                    return lhs.col < rhs.col;
                }
            }
            return false;
        });
    clear_coords(coords.cbegin(), coords.cend());
}